

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

BOOL add_bridges(dw_map *map)

{
  BOOL BVar1;
  uint64_t uVar2;
  int local_124;
  dw_tile tile;
  int count;
  uint64_t which;
  uint8_t y_candidate [120];
  byte abStack_98 [8];
  uint8_t x_candidate [120];
  uint8_t right;
  uint8_t left;
  uint8_t y;
  uint8_t x;
  dw_map *map_local;
  
  local_124 = 0;
  x_candidate[0x76] = '\0';
  do {
    if (0x77 < x_candidate[0x76]) {
LAB_001c8090:
      if (local_124 == 0) {
        map_local._4_4_ = FALSE;
      }
      else {
        uVar2 = mt_rand(0,(long)(local_124 + -1));
        x_candidate[0x77] = abStack_98[uVar2];
        x_candidate[0x76] = y_candidate[uVar2 - 8];
        BVar1 = tile_is_walkable((uint)map->tiles[abStack_98[uVar2]][(int)(x_candidate[0x76] - 1)]);
        if (BVar1 == FALSE) {
          BVar1 = tile_is_walkable((uint)map->tiles[x_candidate[0x77]][(int)(x_candidate[0x76] + 1)]
                                  );
          if (BVar1 == FALSE) {
            map->tiles[x_candidate[0x77]][x_candidate[0x76]] = '\v';
          }
          else {
            map->tiles[x_candidate[0x77]][x_candidate[0x76]] =
                 map->tiles[x_candidate[0x77]][(int)(x_candidate[0x76] + 1)];
          }
        }
        else {
          map->tiles[x_candidate[0x77]][x_candidate[0x76]] =
               map->tiles[x_candidate[0x77]][(int)(x_candidate[0x76] - 1)];
        }
        map_local._4_4_ = TRUE;
      }
      return map_local._4_4_;
    }
    for (x_candidate[0x77] = '\x02'; x_candidate[0x77] < 0x76;
        x_candidate[0x77] = x_candidate[0x77] + '\x01') {
      if (map->tiles[x_candidate[0x77]][x_candidate[0x76]] == '\x04') {
        x_candidate[0x75] = map->walkable[(int)(x_candidate[0x77] - 1)][x_candidate[0x76]];
        x_candidate[0x74] = map->walkable[(int)(x_candidate[0x77] + 1)][x_candidate[0x76]];
        BVar1 = needs_bridge(x_candidate[0x75],x_candidate[0x74]);
        if (BVar1 != FALSE) {
          abStack_98[local_124] = x_candidate[0x77];
          y_candidate[(long)local_124 + -8] = x_candidate[0x76];
          local_124 = local_124 + 1;
        }
      }
      if (0x77 < local_124) {
        printf("Maximum bridge candidates reached\n");
        goto LAB_001c8090;
      }
    }
    x_candidate[0x76] = x_candidate[0x76] + '\x01';
  } while( true );
}

Assistant:

static BOOL add_bridges(dw_map *map)
{
    /* this could use more work */
    uint8_t x, y, left, right, x_candidate[120], y_candidate[120];
    uint64_t which;
    int count = 0;
    dw_tile tile;

    for (y=0; y < 120; y++) {
        for (x=2; x < 118; x++) {
            tile = map->tiles[x][y];
            if (tile == TILE_WATER) {
                left = map->walkable[x-1][y];
                right = map->walkable[x+1][y];
                if (needs_bridge(left, right)){
                    x_candidate[count]   = x;
                    y_candidate[count++] = y;
                }
            }
            if (count >= 120) {
                printf("Maximum bridge candidates reached\n");
                goto max_candidates;
            }
        }
    }
max_candidates:
    if (count) {
        which = mt_rand(0, count-1);
        x = x_candidate[which];
        y = y_candidate[which];
        if (tile_is_walkable(map->tiles[x][y-1])) {
            map->tiles[x][y] = map->tiles[x][y-1];

        } else if (tile_is_walkable(map->tiles[x][y+1])) {
            map->tiles[x][y] = map->tiles[x][y+1];
        } else {
            map->tiles[x][y] = TILE_BRIDGE;
        }
        return TRUE;
    }
    return FALSE;
}